

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

enable_if_t<std::is_integral<unsigned_long>::value,_uintwide_t<128U,_unsigned_int,_void,_false>_>
math::wide_integer::operator<<(uintwide_t<24U,_unsigned_char,_void,_false> *u,unsigned_long n)

{
  uintwide_t<128U,_unsigned_int,_void,_false> local_18;
  
  local_18.values.super_array<unsigned_int,_4UL>.elems._0_8_ = *(undefined8 *)u;
  local_18.values.super_array<unsigned_int,_4UL>.elems._8_8_ =
       *(undefined8 *)(u[2].values.super_array<unsigned_char,_3UL>.elems + 2);
  if (n != 0) {
    if ((n & 0xffffff80) == 0) {
      uintwide_t<128U,_unsigned_int,_void,_false>::shl<unsigned_long>(&local_18,n);
    }
    else {
      local_18.values.super_array<unsigned_int,_4UL>.elems[0] = 0;
      local_18.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
    }
  }
  return (enable_if_t<std::is_integral<unsigned_long>::value,_uintwide_t<128U,_unsigned_int,_void,_false>_>
          )local_18.values.super_array<unsigned_int,_4UL>.elems[0]._0_3_;
}

Assistant:

constexpr auto operator<<(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& u, const IntegralType n) -> std::enable_if_t<std::is_integral<IntegralType>::value, uintwide_t<Width2, LimbType, AllocatorType, IsSigned>> { return uintwide_t<Width2, LimbType, AllocatorType, IsSigned>(u).operator<<=(n); }